

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar4;
  iterator iVar5;
  iterator iVar6;
  OsStackTraceGetterInterface *pOVar7;
  TimeInMillis TVar8;
  TestInfo *this_02;
  TestSuite *in_RDI;
  char *in_stack_00000008;
  offset_in_TestSuite_to_subr in_stack_00000010;
  TestInfo *in_stack_00000020;
  int j;
  int i;
  Timer timer;
  bool skip_all;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  undefined4 in_stack_ffffffffffffff78;
  int iVar9;
  undefined4 in_stack_ffffffffffffff7c;
  UnitTestImpl *this_03;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int i_00;
  int local_58;
  int local_54;
  TestInfo *in_stack_ffffffffffffffd0;
  
  if ((in_RDI->should_run_ & 1U) == 0) {
    return;
  }
  this_00 = internal::GetUnitTestImpl();
  internal::UnitTestImpl::set_current_test_suite(this_00,in_RDI);
  UnitTest::GetInstance();
  this_01 = UnitTest::listeners((UnitTest *)0x15413d);
  pTVar4 = TestEventListeners::repeater(this_01);
  this_03 = (UnitTestImpl *)&in_RDI->test_info_list_;
  iVar5 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin
                    ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  iVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end
                    ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::
  stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestSuite::Run()::__0>
            (iVar5._M_current,iVar6._M_current);
  (*pTVar4->_vptr_TestEventListener[6])(pTVar4,in_RDI);
  (*pTVar4->_vptr_TestEventListener[7])(pTVar4,in_RDI);
  pOVar7 = internal::UnitTestImpl::os_stack_trace_getter(this_03);
  (*pOVar7->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            ((TestSuite *)in_stack_00000020,in_stack_00000010,in_stack_00000008);
  ad_hoc_test_result(in_RDI);
  bVar2 = TestResult::Failed((TestResult *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  i_00 = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
  if (!bVar2) {
    ad_hoc_test_result(in_RDI);
    bVar2 = TestResult::Skipped((TestResult *)this_03);
    i_00 = CONCAT13(bVar2,(int3)i_00);
  }
  uVar1 = (uint)i_00 >> 0x18;
  TVar8 = internal::GetTimeInMillis();
  in_RDI->start_timestamp_ = TVar8;
  internal::Timer::Timer((Timer *)this_03);
  local_54 = 0;
  while (iVar9 = local_54, iVar3 = total_test_count((TestSuite *)0x154260), iVar9 < iVar3) {
    if ((char)uVar1 == '\0') {
      GetMutableTestInfo(in_RDI,i_00);
      TestInfo::Run(in_stack_ffffffffffffffd0);
    }
    else {
      GetMutableTestInfo(in_RDI,i_00);
      TestInfo::Skip(in_stack_00000020);
    }
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      this_02 = GetMutableTestInfo(in_RDI,i_00);
      TestInfo::result(this_02);
      bVar2 = TestResult::Failed((TestResult *)CONCAT44(i_00,in_stack_ffffffffffffff88));
      local_58 = local_54;
      if (bVar2) goto LAB_001542db;
    }
    local_54 = local_54 + 1;
  }
LAB_0015432c:
  TVar8 = internal::Timer::Elapsed((Timer *)in_RDI);
  in_RDI->elapsed_time_ = TVar8;
  pOVar7 = internal::UnitTestImpl::os_stack_trace_getter(this_03);
  (*pOVar7->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            ((TestSuite *)in_stack_00000020,in_stack_00000010,in_stack_00000008);
  (*pTVar4->_vptr_TestEventListener[0xc])(pTVar4,in_RDI);
  (*pTVar4->_vptr_TestEventListener[0xd])(pTVar4,in_RDI);
  internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  return;
LAB_001542db:
  while( true ) {
    local_58 = local_58 + 1;
    iVar9 = local_58;
    iVar3 = total_test_count((TestSuite *)0x1542ec);
    if (iVar3 <= iVar9) break;
    GetMutableTestInfo(in_RDI,i_00);
    TestInfo::Skip(in_stack_00000020);
  }
  goto LAB_0015432c;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}